

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

int solver2_assume(sat_solver2 *s,lit l)

{
  int iVar1;
  int *piVar2;
  lit *plVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  iVar1 = s->qtail;
  if (iVar1 != s->qhead) {
    __assert_fail("s->qtail == s->qhead",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x1df,"int solver2_assume(sat_solver2 *, lit)");
  }
  plVar3 = (lit *)s->assigns;
  lVar6 = (long)(l >> 1);
  if (*(char *)((long)plVar3 + lVar6) == '\x03') {
    uVar4 = (s->trail_lim).size;
    if (uVar4 == (s->trail_lim).cap) {
      iVar5 = (uVar4 >> 1) * 3;
      if ((int)uVar4 < 4) {
        iVar5 = uVar4 * 2;
      }
      piVar2 = (s->trail_lim).ptr;
      if (piVar2 == (int *)0x0) {
        piVar2 = (int *)malloc((long)iVar5 << 2);
      }
      else {
        piVar2 = (int *)realloc(piVar2,(long)iVar5 << 2);
      }
      (s->trail_lim).ptr = piVar2;
      if (piVar2 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->trail_lim).cap * 9.5367431640625e-07,(double)iVar5 * 9.5367431640625e-07)
        ;
        fflush(_stdout);
      }
      (s->trail_lim).cap = iVar5;
      uVar4 = (s->trail_lim).size;
      plVar3 = (lit *)s->assigns;
    }
    (s->trail_lim).size = uVar4 + 1;
    (s->trail_lim).ptr[(int)uVar4] = iVar1;
    if (*(char *)((long)plVar3 + lVar6) == '\x03') {
      *(byte *)((long)plVar3 + lVar6) = (byte)l & 1;
      s->levels[lVar6] = (s->trail_lim).size;
      s->reasons[lVar6] = 0;
      plVar3 = s->trail;
      iVar1 = s->qtail;
      s->qtail = iVar1 + 1;
      plVar3[iVar1] = l;
    }
    return (int)plVar3;
  }
  __assert_fail("var_value(s, lit_var(l)) == varX",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                ,0x1e0,"int solver2_assume(sat_solver2 *, lit)");
}

Assistant:

static inline int solver2_assume(sat_solver2* s, lit l)
{
    assert(s->qtail == s->qhead);
    assert(var_value(s, lit_var(l)) == varX);
#ifdef VERBOSEDEBUG
    Abc_Print(1,L_IND"assume("L_LIT")  ", L_ind, L_lit(l));
    Abc_Print(1, "act = %.20f\n", s->activity[lit_var(l)] );
#endif
    veci_push(&s->trail_lim,s->qtail);
    return solver2_enqueue(s,l,0);
}